

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

void __thiscall sqlite::Connection::Stmt::bind_null(Stmt *this,string *name)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  Logic_error *this_00;
  char *pcVar3;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar1 = this->stmt_;
  iVar2 = bind_parameter_index(this,name);
  iVar2 = sqlite3_bind_null(psVar1,iVar2);
  if (iVar2 == 0) {
    return;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_80,"Error binding ",name);
  std::operator+(&local_60,&local_80,": ");
  pcVar3 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_40,&local_60,pcVar3);
  pcVar3 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_a0,pcVar3,&local_a1);
  Logic_error::Logic_error(this_00,&local_40,&local_a0,iVar2,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind_null(const std::string & name)
    {
        int status = sqlite3_bind_null(stmt_, bind_parameter_index(name));
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }